

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20HM303D.cpp
# Opt level: O0

bool __thiscall RTIMUGD20HM303D::setCompassCTRL5(RTIMUGD20HM303D *this)

{
  uchar ctrl5;
  RTIMUGD20HM303D *this_local;
  
  if ((((this->super_RTIMU).m_settings)->m_GD20HM303DCompassSampleRate < 0) ||
     (5 < ((this->super_RTIMU).m_settings)->m_GD20HM303DCompassSampleRate)) {
    fprintf(_stderr,"Illegal LSM303D compass sample rate code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_GD20HM303DCompassSampleRate);
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                            this->m_accelCompassSlaveAddr,'$',
                            (uchar)(((this->super_RTIMU).m_settings)->m_GD20HM303DCompassSampleRate
                                   << 2),"Failed to set LSM303D CTRL5");
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMUGD20HM303D::setCompassCTRL5()
{
    unsigned char ctrl5;

    if ((m_settings->m_GD20HM303DCompassSampleRate < 0) || (m_settings->m_GD20HM303DCompassSampleRate > 5)) {
        HAL_ERROR1("Illegal LSM303D compass sample rate code %d\n", m_settings->m_GD20HM303DCompassSampleRate);
        return false;
    }

    ctrl5 = (m_settings->m_GD20HM303DCompassSampleRate << 2);

#ifdef GD20HM303D_CACHE_MODE
    //  enable fifo

    ctrl5 |= 0x40;
#endif

    return m_settings->HALWrite(m_accelCompassSlaveAddr,  LSM303D_CTRL5, ctrl5, "Failed to set LSM303D CTRL5");
}